

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcOrientation
          (DeadReckoningCalculator *this,EulerAngles *OrientationOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  float (*pafVar2) [3];
  KFLOAT32 *pKVar3;
  KUINT16 i;
  long lVar4;
  KUINT16 j;
  long lVar5;
  TMATRIX *pTVar6;
  KUINT16 j_1;
  TMATRIX *pTVar7;
  KUINT16 k;
  long lVar8;
  float fVar9;
  TMATRIX DR;
  TMATRIX local_34;
  
  pafVar2 = (float (*) [3])&local_34;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      fVar9 = 1.0;
      if (lVar4 != lVar5) {
        fVar9 = 0.0;
      }
      (*(float (*) [3])*pafVar2)[lVar5] = fVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    pafVar2 = pafVar2 + 1;
  } while (lVar4 != 3);
  if (this->m_bQuaxAxisSet == true) {
    computeDRMatrix_asQuat(this,&local_34,totalTimeSinceReset);
  }
  else {
    computeDRMatrix(this,&local_34,totalTimeSinceReset);
  }
  pafVar2 = (float (*) [3])&local_34;
  lVar4 = 0;
  do {
    lVar5 = 0;
    pTVar6 = &this->m_initOrientationMatrix;
    do {
      fVar9 = 0.0;
      lVar8 = 0;
      pTVar7 = pTVar6;
      do {
        fVar9 = fVar9 + (*(float (*) [3])*pafVar2)[lVar8] * pTVar7->Data[0][0];
        lVar8 = lVar8 + 1;
        pTVar7 = (TMATRIX *)(pTVar7->Data + 1);
      } while (lVar8 != 3);
      local_34.Data[lVar4][lVar5] = fVar9;
      lVar5 = lVar5 + 1;
      pTVar6 = (TMATRIX *)(pTVar6->Data[0] + 1);
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    pafVar2 = pafVar2 + 1;
  } while (lVar4 != 3);
  matrixToHPR_new(&local_34,OrientationOut);
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  fVar9 = (float)*pKVar3;
  if (-3.1415927 <= fVar9) {
    if (3.1415927 < fVar9) {
      fVar9 = fVar9 + -6.2831855;
    }
  }
  else {
    fVar9 = fVar9 + 6.2831855;
  }
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  *pKVar3 = (KFLOAT32)fVar9;
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  fVar9 = (float)*pKVar3;
  if (-1.5707964 <= fVar9) {
    if (fVar9 <= 1.5707964) goto LAB_002a149a;
    fVar1 = 3.1415927;
  }
  else {
    fVar1 = -3.1415927;
  }
  fVar9 = fVar1 - fVar9;
LAB_002a149a:
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  *pKVar3 = (KFLOAT32)fVar9;
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  fVar9 = (float)*pKVar3;
  if (-3.1415927 <= fVar9) {
    if (3.1415927 < fVar9) {
      fVar9 = fVar9 + -6.2831855;
    }
  }
  else {
    fVar9 = fVar9 + 6.2831855;
  }
  pKVar3 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  *pKVar3 = (KFLOAT32)fVar9;
  computeRotationAxis(this,&local_34);
  return;
}

Assistant:

void DeadReckoningCalculator::calcOrientation( EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset  )
{
    // compute the DR matrix
    TMATRIX DR;
    if (m_bQuaxAxisSet)
        computeDRMatrix_asQuat( DR, totalTimeSinceReset );
    else
        computeDRMatrix( DR, totalTimeSinceReset );

    TMATRIX curOrientationMatrix = DR * m_initOrientationMatrix;
    //TMATRIX curOrientationMatrix = m_initOrientationMatrix;

    matrixToHPR_new( curOrientationMatrix, OrientationOut );
    //matrixToHPR( curOrientationMatrix, m_curOrientation );
    OrientationOut[0] = checkAngleHR( OrientationOut[0]);
    OrientationOut[1] = checkAngleP(OrientationOut[1]);
    OrientationOut[2] = checkAngleHR( OrientationOut[2]);

    computeRotationAxis(curOrientationMatrix);
}